

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

int __thiscall
glcts::MissingQualifierTestGroup::init(MissingQualifierTestGroup *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  GLenum mode;
  Context *pCVar2;
  int extraout_EAX;
  long lVar3;
  TestNode *node;
  char *name;
  long lVar4;
  GLenum *pGVar5;
  char *local_40;
  
  lVar4 = 1;
  pGVar5 = &s_modes;
  do {
    if (this->m_missingType == MISSING) {
      local_40 = (char *)0x0;
    }
    else {
      lVar3 = 0;
      if (lVar4 != 0xf) {
        lVar3 = lVar4;
      }
      local_40 = GetLayoutQualifierStr((&s_modes)[lVar3]);
    }
    node = (TestNode *)operator_new(0x88);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    GVar1 = this->m_glslVersion;
    mode = *pGVar5;
    name = GetModeStr(mode);
    tcu::TestCase::TestCase
              ((TestCase *)node,pCVar2->m_testCtx,name,fixed_sample_locations_values + 1);
    node[1]._vptr_TestNode = (_func_int **)pCVar2;
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021151d0;
    *(GLSLVersion *)&node[1].m_testCtx = GVar1;
    *(GLenum *)((long)&node[1].m_testCtx + 4) = mode;
    node[1].m_name._M_dataplus._M_p = local_40;
    tcu::TestNode::addChild((TestNode *)this,node);
    lVar4 = lVar4 + 1;
    pGVar5 = pGVar5 + 1;
  } while (lVar4 != 0x10);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		// Pump individual modes.
		for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_modes); i++)
		{
			const char* qualifier = m_missingType == MISSING ?
										DE_NULL :
										GetLayoutQualifierStr(s_modes[(i + 1) % DE_LENGTH_OF_ARRAY(s_modes)]);
			addChild(new MissingCase(m_context, m_glslVersion, s_modes[i], qualifier));
		}
	}